

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (Printer *p,FieldDescriptor *field,Options *options,bool for_parse,string_view params
               ,string_view strict_function,string_view verify_function)

{
  char cVar1;
  FileOptions_OptimizeMode FVar2;
  long *plVar3;
  char *pcVar4;
  int iVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  long lVar7;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  v;
  long alStack_310 [4];
  undefined1 auStack_2f0 [12];
  uint local_2e4;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_280;
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O3__deps_protobuf_src_src_google_protobuf_io_printer_h:1166:28)>
  local_270;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  local_280._M_str = params._M_str;
  local_280._M_len = params._M_len;
  if (field[2] != (FieldDescriptor)0x9) {
    return;
  }
  local_2e4 = (uint)CONCAT71(in_register_00000009,for_parse);
  local_2a0._0_8_ = local_2a0 + 0x10;
  auStack_2f0._0_8_ = 0x1e49bf;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"params","");
  auStack_2f0._0_8_ = 0x1e49d9;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
            (&local_258,(string *)local_2a0,&local_280);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  auStack_2f0._0_8_ = 0x1e4a02;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Strict","");
  auStack_2f0._0_8_ = 0x1e4a17;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
            (&local_1a0,&local_2c0,&strict_function);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  auStack_2f0._0_8_ = 0x1e4a40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Verify","");
  auStack_2f0._0_8_ = 0x1e4a55;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>&>
            (&local_e8,&local_2e0,&verify_function);
  auStack_2f0._0_8_ = 0x1e4a75;
  vars.len_ = 3;
  vars.ptr_ = &local_258;
  io::Printer::WithDefs(&local_270,p,vars,false);
  lVar7 = 0x228;
  do {
    if (local_270.storage_.callback_buffer_[lVar7 + 8] == '\x01') {
      auStack_2f0._0_8_ = 0x1e4a9f;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_2a0 + lVar7));
    }
    plVar3 = *(long **)((long)&local_2e0.field_2 + lVar7 + 8);
    if ((long *)(local_2a0 + lVar7 + -0x18) != plVar3) {
      auStack_2f0._0_8_ = 0x1e4abb;
      operator_delete(plVar3,*(long *)(local_2a0 + lVar7 + -0x18) + 1);
    }
    auStack_2f0._0_8_ = 0x1e4ace;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_2e0.field_2._M_local_buf[lVar7]]._M_data)
              ((anon_class_1_0_00000001 *)(auStack_2f0 + 0xb),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(auStack_2f0 + lVar7));
    plVar3 = (long *)((long)alStack_310 + lVar7 + 0x10);
    local_2e0.field_2._M_local_buf[lVar7] = -1;
    if (plVar3 != *(long **)((long)alStack_310 + lVar7)) {
      auStack_2f0._0_8_ = 0x1e4aee;
      operator_delete(*(long **)((long)alStack_310 + lVar7),*plVar3 + 1);
    }
    lVar7 = lVar7 + -0xb8;
  } while (lVar7 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    auStack_2f0._0_8_ = 0x1e4b13;
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    auStack_2f0._0_8_ = 0x1e4b34;
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
    auStack_2f0._0_8_ = 0x1e4b4b;
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  auStack_2f0._0_8_ = 0x1e4b59;
  FVar2 = GetOptimizeFor(*(FileDescriptor **)(field + 0x10),options,(bool *)0x0);
  auStack_2f0._0_8_ = 0x1e4b6a;
  cVar1 = google::protobuf::internal::cpp::GetUtf8CheckMode
                    (field,FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME);
  if (cVar1 == '\0') {
    iVar5 = (local_2e4 & 0xff) + 0x81;
    pcVar4 = 
    "\n          DO_($pbi$::WireFormatLite::$Strict$(\n              $params$ $pbi$::WireFormatLite::PARSE, \"$pkg.Msg.field$\"));\n        "
    ;
    pcVar6 = 
    "\n          $pbi$::WireFormatLite::$Strict$(\n              $params$ $pbi$::WireFormatLite::SERIALIZE, \"$pkg.Msg.field$\");\n        "
    ;
  }
  else {
    if (cVar1 != '\x01') goto LAB_001e4bc7;
    iVar5 = (uint)(byte)((byte)local_2e4 ^ 1) * 4 + 0x8c;
    pcVar4 = 
    "\n          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::PARSE,\n                                      \"$pkg.Msg.field$\");\n        "
    ;
    pcVar6 = 
    "\n          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::SERIALIZE,\n                                      \"$pkg.Msg.field$\");\n        "
    ;
  }
  if ((byte)local_2e4 != 0) {
    pcVar6 = pcVar4;
  }
  auStack_2f0._0_8_ = 0x1e4bc7;
  google::protobuf::io::Printer::Emit(p,0,0,iVar5,pcVar6);
LAB_001e4bc7:
  auStack_2f0._0_8_ = 0x1e4bd1;
  absl::lts_20240722::
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_270);
  return;
}

Assistant:

static void GenerateUtf8CheckCode(io::Printer* p, const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  absl::string_view params,
                                  absl::string_view strict_function,
                                  absl::string_view verify_function) {
  if (field->type() != FieldDescriptor::TYPE_STRING) return;

  auto v = p->WithVars({
      {"params", params},
      {"Strict", strict_function},
      {"Verify", verify_function},
  });

  bool is_lite =
      GetOptimizeFor(field->file(), options) == FileOptions::LITE_RUNTIME;
  switch (internal::cpp::GetUtf8CheckMode(field, is_lite)) {
    case internal::cpp::Utf8CheckMode::kStrict:
      if (for_parse) {
        p->Emit(R"cc(
          DO_($pbi$::WireFormatLite::$Strict$(
              $params$ $pbi$::WireFormatLite::PARSE, "$pkg.Msg.field$"));
        )cc");
      } else {
        p->Emit(R"cc(
          $pbi$::WireFormatLite::$Strict$(
              $params$ $pbi$::WireFormatLite::SERIALIZE, "$pkg.Msg.field$");
        )cc");
      }
      break;

    case internal::cpp::Utf8CheckMode::kVerify:
      if (for_parse) {
        p->Emit(R"cc(
          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::PARSE,
                                      "$pkg.Msg.field$");
        )cc");
      } else {
        p->Emit(R"cc(
          $pbi$::WireFormat::$Verify$($params$ $pbi$::WireFormat::SERIALIZE,
                                      "$pkg.Msg.field$");
        )cc");
      }
      break;

    case internal::cpp::Utf8CheckMode::kNone:
      break;
  }
}